

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithops.c
# Opt level: O3

LispPTR N_OP_iremainder(LispPTR tosm1,LispPTR tos)

{
  ulong uVar1;
  ulong uVar2;
  ushort uVar3;
  uint *puVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  LispPTR LVar8;
  
  uVar1 = (ulong)tos;
  uVar2 = (ulong)tosm1;
  if ((tosm1 & 0xfff0000) != 0xf0000) {
    if ((tosm1 & 0xfff0000) == 0xe0000) {
      uVar7 = tosm1 & 0xffff;
      goto LAB_001089ec;
    }
    uVar3 = *(ushort *)((ulong)(tosm1 >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff;
    if (uVar3 == 3) {
      if ((tosm1 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar2);
      }
      if (*(float *)(Lisp_world + uVar2) == 2.1474836e+09) {
        uVar7 = (uint)*(float *)(Lisp_world + uVar2);
        goto LAB_001089ec;
      }
    }
    else if (uVar3 == 2) {
      if ((tosm1 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar2);
      }
      uVar7 = *(uint *)(Lisp_world + uVar2);
      goto LAB_001089ec;
    }
    goto LAB_00108ac5;
  }
  uVar7 = tosm1 | 0xffff0000;
LAB_001089ec:
  if ((tos & 0xfff0000) == 0xf0000) {
    uVar5 = tos | 0xffff0000;
LAB_00108aa3:
    uVar6 = (uint)((long)(int)uVar7 % (long)(int)uVar5);
    if ((uVar6 & 0xffff0000) == 0xffff0000) {
      LVar8 = uVar6 & 0xffff | 0xf0000;
    }
    else if (((long)(int)uVar7 % (long)(int)uVar5 & 0xffff0000U) == 0) {
      LVar8 = uVar6 | 0xe0000;
    }
    else {
      puVar4 = (uint *)createcell68k(2);
      *puVar4 = uVar6;
      if (((ulong)puVar4 & 1) != 0) {
        printf("Misaligned pointer in LAddrFromNative %p\n",puVar4);
      }
      LVar8 = (LispPTR)((ulong)((long)puVar4 - (long)Lisp_world) >> 1);
    }
  }
  else {
    if ((tos & 0xfff0000) == 0xe0000) {
      uVar5 = tos & 0xffff;
LAB_00108a9f:
      if (uVar5 != 0) goto LAB_00108aa3;
    }
    else {
      uVar3 = *(ushort *)((ulong)(tos >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff;
      if (uVar3 == 3) {
        if ((tos & 1) != 0) {
          printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar1);
        }
        if (*(float *)(Lisp_world + uVar1) == 2.1474836e+09) {
          uVar5 = (uint)*(float *)(Lisp_world + uVar1);
          goto LAB_00108a9f;
        }
      }
      else if (uVar3 == 2) {
        if ((tos & 1) != 0) {
          printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar1);
        }
        uVar5 = *(uint *)(Lisp_world + uVar1);
        goto LAB_00108a9f;
      }
    }
LAB_00108ac5:
    MachineState.errorexit = 1;
    LVar8 = 0xffffffff;
    MachineState.tosvalue = tos;
  }
  return LVar8;
}

Assistant:

LispPTR N_OP_iremainder(LispPTR tosm1, LispPTR tos) {
  int arg1, arg2;
  int result;

  N_IGETNUMBER(tosm1, arg1, doufn);
  N_IGETNUMBER(tos, arg2, doufn);
  if (arg2 == 0) goto doufn;

  result = arg1 % arg2;
  N_ARITH_SWITCH(result);

doufn:
  ERROR_EXIT(tos);

}